

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
         *this)

{
  FloatFormat *samplings;
  StatementP *value;
  ostringstream *poVar1;
  ostream *poVar2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar4;
  TestLog *pTVar5;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  MessageBuilder *this_01;
  undefined8 uVar11;
  IVal *pIVar12;
  IVal *value_00;
  IVal *x;
  TestStatus *__return_storage_ptr___00;
  ulong uVar13;
  string *this_02;
  int numErrors;
  FuncSet funcs;
  IVal in1;
  IVal in3;
  FloatFormat highpFmt;
  Environment env;
  void *outputArr [2];
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_> outputs;
  void *inputArr [4];
  IVal in0;
  IVal in2;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa88;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
  *pBVar14;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
  *pBVar15;
  long local_568;
  uint local_55c;
  ulong local_558;
  ulong local_550;
  ulong local_548;
  long local_540;
  FloatFormat *local_538;
  TestStatus *local_530;
  undefined1 local_528 [8];
  undefined8 local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_518;
  _Rb_tree_node_base *local_508;
  size_t local_500;
  string local_4f8;
  TestLog *local_4d8;
  double dStack_4d0;
  double dStack_4c8;
  FloatFormat local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_488;
  pointer local_458;
  pointer local_450;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_> local_448;
  pointer local_418;
  pointer local_410;
  pointer local_408;
  pointer local_400;
  undefined1 local_3f8 [32];
  IVal *local_3d8;
  Precision PStack_3d0;
  undefined4 uStack_3cc;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3c8;
  undefined4 local_3c0;
  string local_278;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_258;
  ResultCollector local_1f8;
  undefined1 local_1a8 [32];
  IVal *local_188;
  double dStack_180;
  
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar4 = (this->m_caseCtx).numRandoms;
  local_530 = __return_storage_ptr__;
  iVar10 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_538 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_258,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar3,(Precision)sVar4,(ulong)(iVar10 + 0xdeadbeef),
             in_stack_fffffffffffffa88);
  uVar13 = (long)local_258.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_258.in0.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>::Outputs(&local_448,uVar13)
  ;
  local_4b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_4b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_4b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_4b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_4b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_4b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_4b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_4b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_4b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_55c = 0;
  local_488._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_488._M_impl.super__Rb_tree_header._M_header;
  local_488._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_488._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_488._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_488._M_impl.super__Rb_tree_header._M_header._M_right =
       local_488._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_418 = local_258.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_410 = local_258.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_408 = local_258.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_400 = local_258.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_458 = local_448.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_450 = local_448.out1.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar1 = (ostringstream *)(local_3f8 + 8);
  local_3f8._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Statement: ");
  value = &this->m_stmt;
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_3f8,value);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_520 = (double)((ulong)local_520._4_4_ << 0x20);
  aStack_518._M_allocated_capacity = 0;
  local_500 = 0;
  pSVar6 = (value->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr;
  aStack_518._8_8_ = (_Rb_tree_node_base *)&local_520;
  local_508 = (_Rb_tree_node_base *)&local_520;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_528);
  for (uVar11 = aStack_518._8_8_; (_Rb_tree_node_base *)uVar11 != (_Rb_tree_node_base *)&local_520;
      uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11)) {
    (**(code **)(**(long **)(uVar11 + 0x20) + 0x30))(*(long **)(uVar11 + 0x20),local_1a8);
  }
  pBVar14 = this;
  if (local_500 != 0) {
    poVar1 = (ostringstream *)(local_3f8 + 8);
    local_3f8._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar1,(string *)&local_4f8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_528);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pSVar7 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar12 = (IVal *)&local_458;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,uVar13 & 0xffffffff,&local_418,pIVar12,0);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_3f8);
  local_528[0] = (string)0x0;
  local_520 = INFINITY;
  aStack_518._M_allocated_capacity = 0xfff0000000000000;
  local_558 = uVar13;
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_1a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_488,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_3f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_488,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_488,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_278);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_488,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d8);
  Environment::bind<float>
            ((Environment *)&local_488,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_528);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_488,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_1a8);
  local_540 = 0;
  local_568 = 0;
  local_550 = 0;
  uVar13 = local_558;
  while (uVar13 != 0) {
    local_4d8 = (TestLog *)((ulong)local_4d8 & 0xffffffffffffff00);
    dStack_4d0 = INFINITY;
    dStack_4c8 = -INFINITY;
    local_548 = uVar13 - 1;
    tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_1a8);
    round<tcu::Vector<float,2>>
              ((IVal *)local_528,(shaderexecutor *)local_538,
               (FloatFormat *)
               ((long)(local_258.in0.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + local_568),
               (Vector<float,_2> *)pIVar12);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_3f8,local_538,(IVal *)local_528);
    pIVar12 = Environment::lookup<tcu::Vector<float,2>>
                        ((Environment *)&local_488,
                         (pBVar14->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                         .m_ptr);
    pIVar12->m_data[1].m_lo = (double)local_3d8;
    pIVar12->m_data[1].m_hi = (double)CONCAT44(uStack_3cc,PStack_3d0);
    pIVar12->m_data[0].m_hi = (double)CONCAT44(local_3f8._20_4_,local_3f8._16_4_);
    *(ulong *)(pIVar12->m_data + 1) = CONCAT44(local_3f8._28_4_,local_3f8._24_4_);
    *(undefined8 *)pIVar12->m_data = local_3f8._0_8_;
    pIVar12->m_data[0].m_lo = (double)CONCAT44(local_3f8._12_4_,local_3f8._8_4_);
    pBVar15 = pBVar14;
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_488,
               (pBVar14->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_488,
               (pBVar14->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_488,
               (pBVar14->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    PStack_3d0 = (pBVar14->m_caseCtx).precision;
    pIVar12 = (IVal *)local_538->m_maxValue;
    local_3f8._0_8_ = *(undefined8 *)local_538;
    local_3f8._8_4_ = local_538->m_fractionBits;
    local_3f8._12_4_ = local_538->m_hasSubnormal;
    local_3f8._16_4_ = local_538->m_hasInf;
    local_3f8._20_4_ = local_538->m_hasNaN;
    local_3f8[0x18] = local_538->m_exactPrecision;
    local_3f8._25_3_ = *(undefined3 *)&local_538->field_0x19;
    local_3f8._28_4_ = *(undefined4 *)&local_538->field_0x1c;
    local_3c0 = 0;
    pSVar6 = (pBVar14->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_3d8 = pIVar12;
    local_3c8 = &local_488;
    (*pSVar6->_vptr_Statement[3])(pSVar6,(IVal *)local_3f8);
    value_00 = Environment::lookup<tcu::Vector<float,2>>
                         ((Environment *)&local_488,
                          (pBVar14->m_variables).out1.
                          super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                          .m_ptr);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
              ((IVal *)local_3f8,&local_4b8,value_00);
    local_1a8._8_8_ = CONCAT44(local_3f8._12_4_,local_3f8._8_4_);
    local_1a8._16_8_ = CONCAT44(local_3f8._20_4_,local_3f8._16_4_);
    local_1a8._28_4_ = local_3f8._28_4_;
    local_1a8._24_4_ = local_3f8._24_4_;
    dStack_180 = (double)CONCAT44(uStack_3cc,PStack_3d0);
    local_188 = local_3d8;
    local_1a8._0_8_ = local_3f8._0_8_;
    bVar8 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                      ((IVal *)local_1a8,
                       (Vector<float,_2> *)
                       ((long)(local_448.out1.
                               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + local_568));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3f8,"Shader output 1 is outside acceptable range",
               (allocator<char> *)local_528);
    bVar8 = tcu::ResultCollector::check(&local_1f8,bVar8,(string *)local_3f8);
    std::__cxx11::string::~string((string *)local_3f8);
    x = Environment::lookup<float>
                  ((Environment *)&local_488,
                   (pBVar15->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
    tcu::FloatFormat::convert((Interval *)local_3f8,&local_4b8,x);
    dStack_4c8 = (double)CONCAT44(local_3f8._20_4_,local_3f8._16_4_);
    dStack_4d0 = (double)CONCAT44(local_3f8._12_4_,local_3f8._8_4_);
    local_4d8 = (TestLog *)local_3f8._0_8_;
    bVar9 = contains<float>((IVal *)&local_4d8,
                            (float *)((long)local_448.out0.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + local_540));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3f8,"Shader output 0 is outside acceptable range",
               (allocator<char> *)local_528);
    bVar9 = tcu::ResultCollector::check(&local_1f8,bVar9,(string *)local_3f8);
    std::__cxx11::string::~string((string *)local_3f8);
    if (!bVar8 || !bVar9) {
      local_55c = (int)local_550 + 1;
      local_550 = (ulong)local_55c;
      if ((int)local_55c < 0x65) {
        poVar1 = (ostringstream *)(local_3f8 + 8);
        local_3f8._0_8_ = pTVar5;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Failed");
        std::operator<<((ostream *)poVar1," sample:\n");
        std::operator<<((ostream *)poVar1,"\t");
        std::__cxx11::string::string
                  ((string *)local_528,
                   (string *)
                   &((pBVar15->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)(local_3f8 + 8),(string *)local_528);
        std::operator<<((ostream *)(local_3f8 + 8)," = ");
        valueToString<tcu::Vector<float,2>>
                  (&local_4f8,(shaderexecutor *)&local_4b8,
                   (FloatFormat *)
                   ((long)(local_258.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_568),
                   (Vector<float,_2> *)pIVar12);
        poVar2 = (ostream *)(local_3f8 + 8);
        std::operator<<(poVar2,(string *)&local_4f8);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)local_528);
        std::operator<<(poVar2,"\t");
        std::__cxx11::string::string
                  ((string *)local_528,
                   (string *)
                   &((pBVar15->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr)->m_name);
        std::operator<<((ostream *)(local_3f8 + 8),(string *)local_528);
        std::operator<<((ostream *)(local_3f8 + 8)," = ");
        valueToString<float>
                  (&local_4f8,&local_4b8,
                   (float *)((long)local_448.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + local_540));
        poVar2 = (ostream *)(local_3f8 + 8);
        std::operator<<(poVar2,(string *)&local_4f8);
        std::operator<<(poVar2,"\n");
        std::operator<<(poVar2,"\tExpected range: ");
        intervalToString<float>(&local_278,&local_4b8,(IVal *)&local_4d8);
        poVar2 = (ostream *)(local_3f8 + 8);
        std::operator<<(poVar2,(string *)&local_278);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)local_528);
        std::operator<<(poVar2,"\t");
        std::__cxx11::string::string
                  ((string *)local_528,
                   (string *)
                   &((pBVar15->m_variables).out1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)(local_3f8 + 8),(string *)local_528);
        std::operator<<((ostream *)(local_3f8 + 8)," = ");
        valueToString<tcu::Vector<float,2>>
                  (&local_4f8,(shaderexecutor *)&local_4b8,
                   (FloatFormat *)
                   ((long)(local_448.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_568),
                   (Vector<float,_2> *)pIVar12);
        poVar2 = (ostream *)(local_3f8 + 8);
        std::operator<<(poVar2,(string *)&local_4f8);
        std::operator<<(poVar2,"\n");
        std::operator<<(poVar2,"\tExpected range: ");
        intervalToString<tcu::Vector<float,2>>
                  (&local_278,(shaderexecutor *)&local_4b8,(FloatFormat *)local_1a8,pIVar12);
        poVar2 = (ostream *)(local_3f8 + 8);
        std::operator<<(poVar2,(string *)&local_278);
        std::operator<<(poVar2,"\n");
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_4f8);
        std::__cxx11::string::~string((string *)local_528);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar2);
      }
    }
    local_568 = local_568 + 8;
    local_540 = local_540 + 4;
    uVar13 = local_548;
    pBVar14 = pBVar15;
  }
  iVar10 = (int)local_550;
  if (iVar10 < 0x65) {
    if (iVar10 == 0) {
      poVar1 = (ostringstream *)(local_3f8 + 8);
      local_3f8._0_8_ = pTVar5;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3f8,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_530;
      tcu::TestStatus::pass(local_530,(string *)local_3f8);
      this_02 = (string *)local_3f8;
      goto LAB_007b2bf9;
    }
  }
  else {
    poVar1 = (ostringstream *)(local_3f8 + 8);
    local_3f8._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"(Skipped ");
    std::ostream::operator<<(poVar1,iVar10 + -100);
    std::operator<<((ostream *)poVar1," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_3f8 + 8);
  local_3f8._0_8_ = pTVar5;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar10);
  std::operator<<((ostream *)poVar1,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  de::toString<int>((string *)local_1a8,(int *)&local_55c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_528," test failed. Check log for the details",
             (allocator<char> *)&local_4f8);
  __return_storage_ptr___00 = local_530;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_3f8);
  std::__cxx11::string::~string((string *)local_3f8);
  std::__cxx11::string::~string((string *)local_528);
  this_02 = (string *)local_1a8;
LAB_007b2bf9:
  std::__cxx11::string::~string(this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_488);
  Outputs<vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>::~Outputs(&local_448);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_258);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}